

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O0

uint ZSTDMT_computeTargetJobLog(ZSTD_CCtx_params *params)

{
  U32 UVar1;
  uint uVar2;
  uint uVar3;
  long in_RDI;
  uint jobLog;
  undefined4 local_1c;
  undefined4 local_14;
  undefined4 local_10;
  undefined4 local_c;
  
  if (*(int *)(in_RDI + 0x60) == 1) {
    UVar1 = ZSTD_cycleLog(*(U32 *)(in_RDI + 8),*(ZSTD_strategy *)(in_RDI + 0x1c));
    if (UVar1 + 3 < 0x15) {
      local_10 = 0x15;
    }
    else {
      UVar1 = ZSTD_cycleLog(*(U32 *)(in_RDI + 8),*(ZSTD_strategy *)(in_RDI + 0x1c));
      local_10 = UVar1 + 3;
    }
    local_c = local_10;
  }
  else {
    if (*(int *)(in_RDI + 4) + 2U < 0x14) {
      local_14 = 0x14;
    }
    else {
      local_14 = *(int *)(in_RDI + 4) + 2;
    }
    local_c = local_14;
  }
  uVar2 = MEM_32bits();
  uVar3 = 0x1e;
  if (uVar2 != 0) {
    uVar3 = 0x1d;
  }
  if (local_c < uVar3) {
    local_1c = local_c;
  }
  else {
    uVar2 = MEM_32bits();
    local_1c = 0x1e;
    if (uVar2 != 0) {
      local_1c = 0x1d;
    }
  }
  return local_1c;
}

Assistant:

static unsigned ZSTDMT_computeTargetJobLog(const ZSTD_CCtx_params* params)
{
    unsigned jobLog;
    if (params->ldmParams.enableLdm == ZSTD_ps_enable) {
        /* In Long Range Mode, the windowLog is typically oversized.
         * In which case, it's preferable to determine the jobSize
         * based on cycleLog instead. */
        jobLog = MAX(21, ZSTD_cycleLog(params->cParams.chainLog, params->cParams.strategy) + 3);
    } else {
        jobLog = MAX(20, params->cParams.windowLog + 2);
    }
    return MIN(jobLog, (unsigned)ZSTDMT_JOBLOG_MAX);
}